

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonlinear_beamformer.cc
# Opt level: O0

void __thiscall
webrtc::NonlinearBeamformer::AimAt(NonlinearBeamformer *this,SphericalPointf *target_direction)

{
  float fVar1;
  SphericalPointf *target_direction_local;
  NonlinearBeamformer *this_local;
  
  fVar1 = SphericalPoint<float>::azimuth(target_direction);
  this->target_angle_radians_ = fVar1;
  InitHighFrequencyCorrectionRanges(this);
  InitInterfAngles(this);
  InitDelaySumMasks(this);
  InitTargetCovMats(this);
  InitInterfCovMats(this);
  NormalizeCovMats(this);
  return;
}

Assistant:

void NonlinearBeamformer::AimAt(const SphericalPointf& target_direction) {
  target_angle_radians_ = target_direction.azimuth();
  InitHighFrequencyCorrectionRanges();
  InitInterfAngles();
  InitDelaySumMasks();
  InitTargetCovMats();
  InitInterfCovMats();
  NormalizeCovMats();
}